

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_columnref_expression.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::ExpressionBinder::QualifyColumnName
          (ExpressionBinder *this,string *column_name,ErrorData *error)

{
  pointer pBVar1;
  bool bVar2;
  OperatorExpression *this_00;
  pointer pOVar3;
  ColumnRefExpression *this_01;
  BinderException *this_02;
  long *plVar4;
  undefined2 *in_RCX;
  ParsedExpression *pPVar5;
  optional_ptr<duckdb::DummyBinding,_true> *poVar6;
  long lVar7;
  pointer alias;
  optional_ptr<duckdb::UsingColumnSet,_true> using_binding;
  templated_unique_single_t coalesce;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  lambda_ref;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  similar_bindings;
  optional_ptr<duckdb::Binding,_true> table_binding;
  optional_ptr<duckdb::UsingColumnSet,_true> local_100;
  BinderException local_f8;
  undefined1 local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  optional_ptr<duckdb::DummyBinding,_true> local_c0;
  optional_idx local_b8;
  undefined1 local_b0 [8];
  _Alloc_hider local_a8;
  undefined1 local_a0 [24];
  _Alloc_hider local_88;
  char local_78 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68 [56];
  
  local_100 = BindContext::GetUsingBinding
                        ((BindContext *)(*(long *)((long)&column_name[1].field_2 + 8) + 0x88),
                         (string *)error);
  if (local_100.ptr != (UsingColumnSet *)0x0) {
    optional_ptr<duckdb::UsingColumnSet,_true>::CheckValid(&local_100);
    bVar2 = BindingAlias::IsSet(&(local_100.ptr)->primary_binding);
    if (bVar2) {
      lVar7 = *(long *)((long)&column_name[1].field_2 + 8);
      optional_ptr<duckdb::UsingColumnSet,_true>::CheckValid(&local_100);
      BindContext::CreateColumnReference
                ((BindContext *)this,(BindingAlias *)(lVar7 + 0x88),(string *)local_100.ptr,
                 (ColumnBindType)error);
      return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              )this;
    }
    this_00 = (OperatorExpression *)operator_new(0x50);
    local_b0 = (undefined1  [8])0x0;
    local_e0._M_dataplus._M_p = (pointer)0x0;
    OperatorExpression::OperatorExpression
              (this_00,OPERATOR_COALESCE,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_b0,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)&local_e0);
    local_f8.super_Exception._0_8_ = this_00;
    if ((long *)local_e0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_e0._M_dataplus._M_p + 8))();
    }
    local_e0._M_dataplus._M_p = (pointer)0x0;
    if (local_b0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_b0 + 8))();
    }
    pOVar3 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
             ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                           *)&local_f8);
    optional_ptr<duckdb::UsingColumnSet,_true>::CheckValid(&local_100);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::reserve(&(pOVar3->children).
               super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
              ,((long)((local_100.ptr)->bindings).
                      super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                      super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)((local_100.ptr)->bindings).
                      super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
                      super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
    local_b8.index = (idx_t)error;
    optional_ptr<duckdb::UsingColumnSet,_true>::CheckValid(&local_100);
    alias = ((local_100.ptr)->bindings).
            super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
            super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl.
            super__Vector_impl_data._M_start;
    pBVar1 = ((local_100.ptr)->bindings).
             super_vector<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>.
             super__Vector_base<duckdb::BindingAlias,_std::allocator<duckdb::BindingAlias>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (alias != pBVar1) {
      do {
        pOVar3 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                 ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                               *)&local_f8);
        this_01 = (ColumnRefExpression *)operator_new(0x50);
        local_b0 = (undefined1  [8])local_a0;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_b0,*(long *)local_b8.index,
                   (((string *)(local_b8.index + 8))->_M_dataplus)._M_p + *(long *)local_b8.index);
        ColumnRefExpression::ColumnRefExpression(this_01,(string *)local_b0,alias);
        if (local_b0 != (undefined1  [8])local_a0) {
          operator_delete((void *)local_b0);
        }
        local_e0._M_dataplus._M_p = (pointer)this_01;
        ::std::
        vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                    *)&pOVar3->children,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_e0);
        if ((ColumnRefExpression *)local_e0._M_dataplus._M_p != (ColumnRefExpression *)0x0) {
          (**(code **)(*(long *)local_e0._M_dataplus._M_p + 8))();
        }
        alias = alias + 1;
      } while (alias != pBVar1);
    }
    this->_vptr_ExpressionBinder = (_func_int **)local_f8.super_Exception._0_8_;
    return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
            )this;
  }
  LambdaRefExpression::FindMatchingBinding
            ((LambdaRefExpression *)local_e8,
             (optional_ptr<duckdb::vector<duckdb::DummyBinding,_true>,_true> *)
             &column_name[1]._M_string_length,(string *)error);
  if (local_e8 != (undefined1  [8])0x0) {
    this->_vptr_ExpressionBinder = (_func_int **)local_e8;
    local_e8 = (undefined1  [8])0x0;
    goto LAB_00d953f7;
  }
  local_c0.ptr = (DummyBinding *)
                 BindContext::GetMatchingBinding
                           ((BindContext *)(*(long *)((long)&column_name[1].field_2 + 8) + 0x88),
                            (string *)error);
  lVar7 = *(long *)((long)&column_name[1].field_2 + 8);
  if (*(long *)(lVar7 + 0x1a8) == 0) {
LAB_00d952e7:
    if (local_c0.ptr == (DummyBinding *)0x0) {
      BindContext::GetSimilarBindings
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_e0,(BindContext *)(*(long *)((long)&column_name[1].field_2 + 8) + 0x88),
                 (string *)error);
      BinderException::ColumnNotFound
                (&local_f8,(string *)error,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                  *)&local_e0,(QueryErrorContext)0xffffffffffffffff);
      ErrorData::ErrorData((ErrorData *)local_b0,(exception *)&local_f8);
      *in_RCX = local_b0._0_2_;
      ::std::__cxx11::string::operator=((string *)(in_RCX + 4),(string *)&local_a8);
      ::std::__cxx11::string::operator=((string *)(in_RCX + 0x14),(string *)&local_88);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)(in_RCX + 0x24),local_68);
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
      ::~_Hashtable(local_68);
      if (local_88._M_p != local_78) {
        operator_delete(local_88._M_p);
      }
      if (local_a8._M_p != local_a0 + 8) {
        operator_delete(local_a8._M_p);
      }
      ::std::runtime_error::~runtime_error((runtime_error *)&local_f8);
      this->_vptr_ExpressionBinder = (_func_int **)0x0;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_e0);
      goto LAB_00d953f7;
    }
    lVar7 = *(long *)((long)&column_name[1].field_2 + 8);
    poVar6 = &local_c0;
    optional_ptr<duckdb::Binding,_true>::CheckValid((optional_ptr<duckdb::Binding,_true> *)poVar6);
  }
  else {
    poVar6 = (optional_ptr<duckdb::DummyBinding,_true> *)(lVar7 + 0x1a8);
    optional_ptr<duckdb::DummyBinding,_true>::CheckValid(poVar6);
    bVar2 = Binding::HasMatchingBinding(&poVar6->ptr->super_Binding,(string *)error);
    if (!bVar2) goto LAB_00d952e7;
    if (local_c0.ptr != (DummyBinding *)0x0) {
      this_02 = (BinderException *)__cxa_allocate_exception(0x10);
      ::std::operator+(&local_e0,"Conflicting column names for column ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)error);
      plVar4 = (long *)::std::__cxx11::string::append((char *)&local_e0);
      local_b0 = (undefined1  [8])*plVar4;
      pPVar5 = (ParsedExpression *)(plVar4 + 2);
      if (local_b0 == (undefined1  [8])pPVar5) {
        local_a0._0_8_ = (pPVar5->super_BaseExpression)._vptr_BaseExpression;
        local_a0._8_8_ = plVar4[3];
        local_b0 = (undefined1  [8])local_a0;
      }
      else {
        local_a0._0_8_ = (pPVar5->super_BaseExpression)._vptr_BaseExpression;
      }
      local_a8._M_p = (pointer)plVar4[1];
      *plVar4 = (long)pPVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      BinderException::BinderException(this_02,(string *)local_b0);
      __cxa_throw(this_02,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    lVar7 = *(long *)((long)&column_name[1].field_2 + 8);
    poVar6 = (optional_ptr<duckdb::DummyBinding,_true> *)(lVar7 + 0x1a8);
    optional_ptr<duckdb::DummyBinding,_true>::CheckValid(poVar6);
  }
  BindContext::CreateColumnReference
            ((BindContext *)this,(BindingAlias *)(lVar7 + 0x88),
             &(poVar6->ptr->super_Binding).alias.catalog,(ColumnBindType)error);
LAB_00d953f7:
  if (local_e8 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_e8 + 8))();
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>)
         this;
}

Assistant:

unique_ptr<ParsedExpression> ExpressionBinder::QualifyColumnName(const string &column_name, ErrorData &error) {
	auto using_binding = binder.bind_context.GetUsingBinding(column_name);
	if (using_binding) {
		// we are referencing a USING column
		// check if we can refer to one of the base columns directly
		unique_ptr<Expression> expression;
		if (using_binding->primary_binding.IsSet()) {
			// we can! just assign the table name and re-bind
			return binder.bind_context.CreateColumnReference(using_binding->primary_binding, column_name);
		} else {
			// we cannot! we need to bind this as COALESCE between all the relevant columns
			auto coalesce = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_COALESCE);
			coalesce->children.reserve(using_binding->bindings.size());
			for (auto &entry : using_binding->bindings) {
				coalesce->children.push_back(make_uniq<ColumnRefExpression>(column_name, entry));
			}
			return std::move(coalesce);
		}
	}

	// try binding as a lambda parameter
	auto lambda_ref = LambdaRefExpression::FindMatchingBinding(lambda_bindings, column_name);
	if (lambda_ref) {
		return lambda_ref;
	}

	// find a table binding that contains this column name
	auto table_binding = binder.bind_context.GetMatchingBinding(column_name);

	// throw an error if a macro parameter name conflicts with a column name
	auto is_macro_column = false;
	if (binder.macro_binding && binder.macro_binding->HasMatchingBinding(column_name)) {
		is_macro_column = true;
		if (table_binding) {
			throw BinderException("Conflicting column names for column " + column_name + "!");
		}
	}

	// bind as a macro column
	if (is_macro_column) {
		return binder.bind_context.CreateColumnReference(binder.macro_binding->alias, column_name);
	}

	// bind as a regular column
	if (table_binding) {
		return binder.bind_context.CreateColumnReference(table_binding->alias, column_name);
	}

	// it's not, find candidates and error
	auto similar_bindings = binder.bind_context.GetSimilarBindings(column_name);
	error = ErrorData(BinderException::ColumnNotFound(column_name, similar_bindings));
	return nullptr;
}